

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O0

int lib::base::Print(State *state)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Closure *pCVar4;
  Table *pTVar5;
  UserData *pUVar6;
  CFunctionType p_Var7;
  State *in_RDI;
  ValueT type;
  int i;
  int params;
  StackAPI api;
  StackAPI *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  ValueT in_stack_ffffffffffffffdc;
  int local_20;
  StackAPI local_18;
  
  luna::StackAPI::StackAPI(&local_18,in_RDI);
  iVar2 = luna::StackAPI::GetStackSize(in_stack_ffffffffffffffd0);
  for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
    in_stack_ffffffffffffffdc =
         luna::StackAPI::GetValueType
                   ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    in_stack_ffffffffffffffd0 = (StackAPI *)(ulong)in_stack_ffffffffffffffdc;
    switch(in_stack_ffffffffffffffd0) {
    case (StackAPI *)0x0:
      printf("nil");
      break;
    case (StackAPI *)0x1:
      bVar1 = luna::StackAPI::GetBool
                        ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0
                        );
      pcVar3 = "false";
      if (bVar1) {
        pcVar3 = "true";
      }
      printf("%s",pcVar3);
      break;
    case (StackAPI *)0x2:
      luna::StackAPI::GetNumber
                ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      printf("%.14g");
      break;
    default:
      break;
    case (StackAPI *)0x4:
      pcVar3 = luna::StackAPI::GetCString
                         ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          0);
      printf("%s",pcVar3);
      break;
    case (StackAPI *)0x5:
      pCVar4 = luna::StackAPI::GetClosure
                         ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          0);
      printf("function:\t%p",pCVar4);
      break;
    case (StackAPI *)0x7:
      pTVar5 = luna::StackAPI::GetTable
                         ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          0);
      printf("table:\t%p",pTVar5);
      break;
    case (StackAPI *)0x8:
      pUVar6 = luna::StackAPI::GetUserData
                         ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          0);
      printf("userdata:\t%p",pUVar6);
      break;
    case (StackAPI *)0x9:
      p_Var7 = luna::StackAPI::GetCFunction
                         ((StackAPI *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          0);
      printf("function:\t%p",p_Var7);
    }
    if (local_20 != iVar2 + -1) {
      printf("\t");
    }
  }
  printf("\n");
  return 0;
}

Assistant:

int Print(luna::State *state)
    {
        luna::StackAPI api(state);
        int params = api.GetStackSize();

        for (int i = 0; i < params; ++i)
        {
            luna::ValueT type = api.GetValueType(i);

            switch (type) {
                case luna::ValueT_Nil:
                    printf("nil");
                    break;
                case luna::ValueT_Bool:
                    printf("%s", api.GetBool(i) ? "true" : "false");
                    break;
                case luna::ValueT_Number:
                    printf("%.14g", api.GetNumber(i));
                    break;
                case luna::ValueT_String:
                    printf("%s", api.GetCString(i));
                    break;
                case luna::ValueT_Closure:
                    printf("function:\t%p", api.GetClosure(i));
                    break;
                case luna::ValueT_Table:
                    printf("table:\t%p", api.GetTable(i));
                    break;
                case luna::ValueT_UserData:
                    printf("userdata:\t%p", api.GetUserData(i));
                    break;
                case luna::ValueT_CFunction:
                    printf("function:\t%p", api.GetCFunction(i));
                    break;
                default:
                    break;
            }

            if (i != params - 1)
                printf("\t");
        }

        printf("\n");
        return 0;
    }